

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

FIOBJ fiobj_str_buf(size_t capa)

{
  void *__dest;
  int *piVar1;
  fio_str_info_s local_70;
  undefined1 local_58 [4];
  undefined4 local_54;
  undefined8 local_50;
  undefined1 local_48 [48];
  void *local_18;
  fiobj_str_s *s;
  size_t capa_local;
  
  if (capa == 0) {
    s = (fiobj_str_s *)capa;
    s = (fiobj_str_s *)sysconf(0x1e);
  }
  else {
    s = (fiobj_str_s *)(capa + 1);
  }
  __dest = fio_malloc(0x40);
  local_18 = __dest;
  if (__dest == (void *)0x0) {
    perror("ERROR: fiobj string couldn\'t allocate memory");
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  local_58[0] = 0x28;
  local_54 = 1;
  local_50 = 0;
  memset(local_48,0,0x30);
  local_48[0] = 1;
  memcpy(__dest,local_58,0x40);
  if (s != (fiobj_str_s *)0x0) {
    fio_str_capa_assert(&local_70,(fio_str_s_conflict *)((long)local_18 + 0x10),(size_t)s);
  }
  return (ulong)local_18 | 2;
}

Assistant:

FIOBJ fiobj_str_buf(size_t capa) {
  if (capa)
    capa = capa + 1;
  else
    capa = PAGE_SIZE;

  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (capa) {
    fio_str_capa_assert(&s->str, capa);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}